

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O2

PClassActor * DecoDerivedClass(FScriptPosition *sc,PClassActor *parent,FName *typeName)

{
  PClassActor *pPVar1;
  FString *this;
  FString newname;
  FString sourcefile;
  FName local_30;
  FName local_2c;
  
  local_2c = (FName)typeName->Index;
  pPVar1 = (PClassActor *)
           PClass::CreateDerivedClass
                     (&parent->super_PClass,&local_2c,
                      *(uint *)((long)&(parent->super_PClass).super_PNativeStruct.super_PStruct.
                                       super_PNamedType.super_PCompoundType.super_PType.
                                       super_PTypeBase + 0x24));
  if (pPVar1 == (PClassActor *)0x0) {
    FString::FString(&newname,FName::NameData.NameArray[typeName->Index].Text);
    FString::AttachToOther(&sourcefile,&sc->FileName);
    FString::Substitute(&sourcefile,":","@");
    this = FString::operator+=(&newname,'@');
    FString::operator+=(this,&sourcefile);
    if (strictdecorate.Value == true) {
      FScriptPosition::Message
                (sc,2,"Tried to define class \'%s\' more than once.",
                 FName::NameData.NameArray[typeName->Index].Text);
    }
    else {
      FScriptPosition::Message
                (sc,0,"Tried to define class \'%s\' more than once. Renaming class to \'%s\'",
                 FName::NameData.NameArray[typeName->Index].Text,newname.Chars);
    }
    FName::FName(&local_30,&newname);
    pPVar1 = (PClassActor *)
             PClass::CreateDerivedClass
                       (&parent->super_PClass,&local_30,
                        *(uint *)((long)&(parent->super_PClass).super_PNativeStruct.super_PStruct.
                                         super_PNamedType.super_PCompoundType.super_PType.
                                         super_PTypeBase + 0x24));
    if (pPVar1 == (PClassActor *)0x0) {
      FScriptPosition::Message
                (sc,1,"Tried to define class \'%s\' more than twice in the same file.",
                 FName::NameData.NameArray[typeName->Index].Text);
    }
    FString::~FString(&sourcefile);
    FString::~FString(&newname);
  }
  return pPVar1;
}

Assistant:

PClassActor *DecoDerivedClass(const FScriptPosition &sc, PClassActor *parent, FName typeName)
{
	PClassActor *type = static_cast<PClassActor *>(parent->CreateDerivedClass(typeName, parent->Size));
	if (type == nullptr)
	{
		FString newname = typeName.GetChars();
		FString sourcefile = sc.FileName;

		sourcefile.Substitute(":", "@");
		newname << '@' << sourcefile;
		if (strictdecorate)
		{
			sc.Message(MSG_ERROR, "Tried to define class '%s' more than once.", typeName.GetChars());
		}
		else
		{
			// Due to backwards compatibility issues this cannot be an unconditional error.
			sc.Message(MSG_WARNING, "Tried to define class '%s' more than once. Renaming class to '%s'", typeName.GetChars(), newname.GetChars());
		}
		type = static_cast<PClassActor *>(parent->CreateDerivedClass(newname, parent->Size));
		if (type == nullptr)
		{
			// This we cannot handle cleanly anymore. Let's just abort and forget about the odd mod out that was this careless.
			sc.Message(MSG_FATAL, "Tried to define class '%s' more than twice in the same file.", typeName.GetChars());
		}
	}
	return type;
}